

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_send_cack(udp_ep *ep,udp_pipe *p)

{
  undefined1 local_2c [8];
  udp_sp_cack cack;
  udp_pipe *p_local;
  udp_ep *ep_local;
  
  local_2c[0] = '\x01';
  local_2c[1] = '\x02';
  local_2c._2_2_ = p->proto;
  local_2c._4_4_ = p->self_id;
  cack._0_4_ = p->peer_id;
  cack.us_sender_id = p->self_seq;
  p->self_seq = cack.us_sender_id + 1;
  cack.us_peer_id._0_2_ = p->rcvmax;
  cack.us_peer_id._3_1_ = (undefined1)((p->refresh + 999) / 1000);
  cack._12_8_ = p;
  udp_queue_tx(ep,&p->peer_addr,(udp_sp_msg *)local_2c,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_send_cack(udp_ep *ep, udp_pipe *p)
{
	udp_sp_cack cack;
	cack.us_ver       = 0x01;
	cack.us_op_code   = OPCODE_CACK;
	cack.us_type      = p->proto;
	cack.us_sender_id = p->self_id;
	cack.us_peer_id   = p->peer_id;
	cack.us_sequence  = p->self_seq++;
	cack.us_recv_max  = p->rcvmax;
	cack.us_refresh   = (p->refresh + NNI_SECOND - 1) / NNI_SECOND;
	udp_queue_tx(ep, &p->peer_addr, (void *) &cack, NULL);
}